

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

string * duckdb_parquet::to_string_abi_cxx11_(type *val)

{
  char *pcVar1;
  bool bVar2;
  const_iterator cVar3;
  pointer ppVar4;
  undefined4 *in_RSI;
  string *in_RDI;
  const_iterator it;
  map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  *in_stack_ffffffffffffff98;
  allocator local_29;
  _Self local_28;
  undefined4 local_1c;
  int __val;
  
  local_1c = *in_RSI;
  cVar3 = std::
          map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
          ::find(in_stack_ffffffffffffff98,(key_type_conflict1 *)0x6f1c47);
  __val = (int)((ulong)cVar3._M_node >> 0x20);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar2 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_28);
  if (bVar2) {
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_char_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_char_*>_> *)0x6f1c7c);
    pcVar1 = ppVar4->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::to_string(__val);
  }
  return in_RDI;
}

Assistant:

std::string to_string(const BoundaryOrder::type& val) {
  std::map<int, const char*>::const_iterator it = _BoundaryOrder_VALUES_TO_NAMES.find(val);
  if (it != _BoundaryOrder_VALUES_TO_NAMES.end()) {
    return std::string(it->second);
  } else {
    return std::to_string(static_cast<int>(val));
  }
}